

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int is_winzip_aes_encryption_supported(int encryption)

{
  int iVar1;
  archive_hmac_sha1_ctx local_90;
  int ret;
  archive_hmac_sha1_ctx hctx;
  archive_crypto_ctx cctx;
  uint8_t derived_key [66];
  uint8_t local_38 [8];
  uint8_t salt [18];
  size_t salt_len;
  size_t key_len;
  int encryption_local;
  
  if (encryption == 2) {
    stack0xffffffffffffffe0 = 8;
    salt_len = 0x10;
  }
  else {
    stack0xffffffffffffffe0 = 0x10;
    salt_len = 0x20;
  }
  iVar1 = archive_random(local_38,stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    iVar1 = pbkdf2_sha1("p",1,local_38,stack0xffffffffffffffe0,1000,(uint8_t *)&hctx,
                        salt_len * 2 + 2);
    if (iVar1 == 0) {
      iVar1 = aes_ctr_init(&ret,(uint8_t *)&hctx,salt_len);
      if (iVar1 == 0) {
        iVar1 = __hmac_sha1_init(&local_90,(uint8_t *)((long)&hctx + salt_len),salt_len);
        aes_ctr_release(&ret);
        if (iVar1 == 0) {
          __hmac_sha1_cleanup(&local_90);
          key_len._4_4_ = 1;
        }
        else {
          key_len._4_4_ = 0;
        }
      }
      else {
        key_len._4_4_ = 0;
      }
    }
    else {
      key_len._4_4_ = 0;
    }
  }
  else {
    key_len._4_4_ = 0;
  }
  return key_len._4_4_;
}

Assistant:

static int
is_winzip_aes_encryption_supported(int encryption)
{
	size_t key_len, salt_len;
	uint8_t salt[16 + 2];
	uint8_t derived_key[MAX_DERIVED_KEY_BUF_SIZE];
	archive_crypto_ctx cctx;
	archive_hmac_sha1_ctx hctx;
	int ret;

	if (encryption == ENCRYPTION_WINZIP_AES128) {
		salt_len = 8;
		key_len = 16;
	} else {
		/* AES 256 */
		salt_len = 16;
		key_len = 32;
	}
	if (archive_random(salt, salt_len) != ARCHIVE_OK)
		return (0);
	ret = archive_pbkdf2_sha1("p", 1, salt, salt_len, 1000,
	    derived_key, key_len * 2 + 2);
	if (ret != 0)
		return (0);

	ret = archive_encrypto_aes_ctr_init(&cctx, derived_key, key_len);
	if (ret != 0)
		return (0);
	ret = archive_hmac_sha1_init(&hctx, derived_key + key_len,
	    key_len);
	archive_encrypto_aes_ctr_release(&cctx);
	if (ret != 0)
		return (0);
	archive_hmac_sha1_cleanup(&hctx);
	return (1);
}